

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_stdio.c
# Opt level: O0

off_t file_stdio_fsize(ALLEGRO_FILE *f)

{
  _Bool _Var1;
  int64_t iVar2;
  int64_t in_RDI;
  int64_t new_pos;
  int64_t old_pos;
  ALLEGRO_FILE *in_stack_ffffffffffffffe0;
  int whence;
  ALLEGRO_FILE *in_stack_fffffffffffffff8;
  
  iVar2 = file_stdio_ftell(in_stack_ffffffffffffffe0);
  if (iVar2 == -1) {
    iVar2 = -1;
  }
  else {
    _Var1 = file_stdio_fseek(in_stack_fffffffffffffff8,in_RDI,(int)((ulong)iVar2 >> 0x20));
    whence = (int)((ulong)iVar2 >> 0x20);
    if (_Var1) {
      iVar2 = file_stdio_ftell(in_stack_ffffffffffffffe0);
      if (iVar2 == -1) {
        iVar2 = -1;
      }
      else {
        _Var1 = file_stdio_fseek(in_stack_fffffffffffffff8,in_RDI,whence);
        if (!_Var1) {
          iVar2 = -1;
        }
      }
    }
    else {
      iVar2 = -1;
    }
  }
  return iVar2;
}

Assistant:

static off_t file_stdio_fsize(ALLEGRO_FILE *f)
{
   int64_t old_pos;
   int64_t new_pos;

   old_pos = file_stdio_ftell(f);
   if (old_pos == -1)
      return -1;

   if (!file_stdio_fseek(f, 0, ALLEGRO_SEEK_END))
      return -1;

   new_pos = file_stdio_ftell(f);
   if (new_pos == -1)
      return -1;

   if (!file_stdio_fseek(f, old_pos, ALLEGRO_SEEK_SET))
      return -1;

   return new_pos;
}